

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

ReduceMeanLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::ReduceMeanLayerParams>
          (Arena *arena)

{
  ReduceMeanLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (ReduceMeanLayerParams *)operator_new(0x30);
    CoreML::Specification::ReduceMeanLayerParams::ReduceMeanLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (ReduceMeanLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x30,
                      (type_info *)&CoreML::Specification::ReduceMeanLayerParams::typeinfo);
    CoreML::Specification::ReduceMeanLayerParams::ReduceMeanLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }